

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

RegisterSpace * Js::AllocateRegisterSpace(ArenaAllocator *alloc,Types type)

{
  code *pcVar1;
  bool bVar2;
  AsmJsRegisterSpace<double> *this;
  undefined4 *puVar3;
  
  switch(type) {
  case INT32:
    this = (AsmJsRegisterSpace<double> *)new<Memory::ArenaAllocator>(0x50,alloc,0x35916e);
    AsmJsRegisterSpace<int>::AsmJsRegisterSpace((AsmJsRegisterSpace<int> *)this,alloc);
    break;
  case INT64:
    this = (AsmJsRegisterSpace<double> *)new<Memory::ArenaAllocator>(0x50,alloc,0x35916e);
    AsmJsRegisterSpace<long>::AsmJsRegisterSpace((AsmJsRegisterSpace<long> *)this,alloc);
    break;
  case FLOAT32:
    this = (AsmJsRegisterSpace<double> *)new<Memory::ArenaAllocator>(0x50,alloc,0x35916e);
    AsmJsRegisterSpace<float>::AsmJsRegisterSpace((AsmJsRegisterSpace<float> *)this,alloc);
    break;
  case FLOAT64:
    this = (AsmJsRegisterSpace<double> *)new<Memory::ArenaAllocator>(0x50,alloc,0x35916e);
    AsmJsRegisterSpace<double>::AsmJsRegisterSpace(this,alloc);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x2c4,"(false)","Invalid native asm.js type");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    Throw::InternalError();
  }
  return &this->super_RegisterSpace;
}

Assistant:

WAsmJs::RegisterSpace*
        AllocateRegisterSpace(ArenaAllocator* alloc, WAsmJs::Types type)
    {
        switch(type)
        {
        case WAsmJs::INT32: return Anew(alloc, AsmJsRegisterSpace<int>, alloc);
        case WAsmJs::FLOAT32: return Anew(alloc, AsmJsRegisterSpace<float>, alloc);
        case WAsmJs::FLOAT64: return Anew(alloc, AsmJsRegisterSpace<double>, alloc);
#if TARGET_64
        case WAsmJs::INT64: return Anew(alloc, AsmJsRegisterSpace<int64>, alloc);
#endif
        default:
            AssertMsg(false, "Invalid native asm.js type");
            Js::Throw::InternalError();
        }
    }